

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IexBaseExc.cpp
# Opt level: O3

void __thiscall Iex_3_2::NoImplExc::~NoImplExc(NoImplExc *this)

{
  EdircorruptedExc::~EdircorruptedExc((EdircorruptedExc *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

BaseExc::~BaseExc () noexcept
{}